

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::remove_connection(torrent *this,peer_connection *p)

{
  bool bVar1;
  const_iterator local_30;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  local_28;
  __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
  local_20;
  iterator i;
  peer_connection *p_local;
  torrent *this_local;
  
  i._M_current = (peer_connection **)p;
  local_20._M_current =
       (peer_connection **)
       sorted_find<libtorrent::aux::container_wrapper<libtorrent::aux::peer_connection*,int,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>,libtorrent::aux::peer_connection_const*>
                 (&(this->super_torrent_hot_members).m_connections,(peer_connection **)&i);
  local_28._M_current =
       (peer_connection **)
       ::std::
       vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
       ::end(&(this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            );
  bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::peer_connection*const*,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
    ::__normal_iterator<libtorrent::aux::peer_connection**>
              ((__normal_iterator<libtorrent::aux::peer_connection*const*,std::vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>>
                *)&local_30,&local_20);
    ::std::
    vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ::erase(&(this->super_torrent_hot_members).m_connections.
             super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ,local_30);
  }
  return;
}

Assistant:

void torrent::remove_connection(peer_connection const* p)
	{
		TORRENT_ASSERT(m_iterating_connections == 0);
		auto const i = sorted_find(m_connections, p);
		if (i != m_connections.end())
			m_connections.erase(i);
	}